

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema_compile.c
# Opt level: O0

LY_ERR lys_compile_identities(lys_module *mod)

{
  lysp_submodule *plVar1;
  LY_ERR LVar2;
  ulong local_10e8;
  ulong local_10d8;
  ulong local_10c8;
  uint64_t u;
  lysp_submodule *submod;
  lysc_ctx ctx;
  LY_ERR rc;
  lys_module *mod_local;
  
  ctx.path[0xfec] = '\0';
  ctx.path[0xfed] = '\0';
  ctx._4254_2_ = 0;
  memset(&submod,0,0x10a0);
  ctx._4252_4_ = lys_identity_precompile
                           ((lysc_ctx *)0x0,mod->ctx,mod->parsed,mod->parsed->identities,
                            &mod->identities);
  if (ctx._4252_4_ == LY_SUCCESS) {
    local_10c8 = 0;
    while( true ) {
      if (mod->parsed->includes == (lysp_include *)0x0) {
        local_10d8 = 0;
      }
      else {
        local_10d8 = *(ulong *)(mod->parsed->includes[-1].rev + 8);
      }
      if (local_10d8 <= local_10c8) break;
      plVar1 = mod->parsed->includes[local_10c8].submodule;
      ctx._4252_4_ = lys_identity_precompile
                               ((lysc_ctx *)0x0,mod->ctx,(lysp_module *)plVar1,plVar1->identities,
                                &mod->identities);
      if (ctx._4252_4_ != LY_SUCCESS) goto LAB_00164648;
      local_10c8 = local_10c8 + 1;
    }
    submod = (lysp_submodule *)mod->parsed->mod->ctx;
    ctx.ctx = (ly_ctx *)mod->parsed->mod;
    ctx.cur_mod = (lys_module *)mod->parsed;
    ctx.pmod = (lysp_module *)0x0;
    ctx.unres._0_4_ = 1;
    ctx.free_ctx.ext_set.field_2._0_1_ = 0x2f;
    ctx._136_8_ = mod->parsed->mod->ctx;
    if ((mod->parsed->identities == (lysp_ident *)0x0) ||
       (ctx._4252_4_ = lys_compile_identities_derived
                                 ((lysc_ctx *)&submod,mod->parsed->identities,&mod->identities),
       ctx._4252_4_ == LY_SUCCESS)) {
      lysc_update_path((lysc_ctx *)&submod,(lys_module *)0x0,"{submodule}");
      local_10c8 = 0;
      goto LAB_0016452c;
    }
  }
LAB_00164648:
  ly_log_location_revert(0,0,1,0);
  LVar2._0_1_ = ctx.path[0xfec];
  LVar2._1_1_ = ctx.path[0xfed];
  LVar2._2_2_ = ctx._4254_2_;
  return LVar2;
LAB_0016452c:
  if (mod->parsed->includes == (lysp_include *)0x0) {
    local_10e8 = 0;
  }
  else {
    local_10e8 = *(ulong *)(mod->parsed->includes[-1].rev + 8);
  }
  if (local_10e8 <= local_10c8) goto LAB_00164635;
  plVar1 = mod->parsed->includes[local_10c8].submodule;
  if (plVar1->identities != (lysp_ident *)0x0) {
    ctx.cur_mod = (lys_module *)plVar1;
    lysc_update_path((lysc_ctx *)&submod,(lys_module *)0x0,plVar1->name);
    ctx._4252_4_ = lys_compile_identities_derived
                             ((lysc_ctx *)&submod,plVar1->identities,&mod->identities);
    lysc_update_path((lysc_ctx *)&submod,(lys_module *)0x0,(char *)0x0);
  }
  if (ctx._4252_4_ != 0) goto LAB_00164635;
  local_10c8 = local_10c8 + 1;
  goto LAB_0016452c;
LAB_00164635:
  lysc_update_path((lysc_ctx *)&submod,(lys_module *)0x0,(char *)0x0);
  goto LAB_00164648;
}

Assistant:

LY_ERR
lys_compile_identities(struct lys_module *mod)
{
    LY_ERR rc = LY_SUCCESS;
    struct lysc_ctx ctx = {0};
    struct lysp_submodule *submod;
    LY_ARRAY_COUNT_TYPE u;

    /* pre-compile identities of the module and any submodules */
    rc = lys_identity_precompile(NULL, mod->ctx, mod->parsed, mod->parsed->identities, &mod->identities);
    LY_CHECK_GOTO(rc, cleanup);
    LY_ARRAY_FOR(mod->parsed->includes, u) {
        submod = mod->parsed->includes[u].submodule;
        rc = lys_identity_precompile(NULL, mod->ctx, (struct lysp_module *)submod, submod->identities, &mod->identities);
        LY_CHECK_GOTO(rc, cleanup);
    }

    /* prepare context */
    LYSC_CTX_INIT_PMOD(ctx, mod->parsed, NULL);

    if (mod->parsed->identities) {
        rc = lys_compile_identities_derived(&ctx, mod->parsed->identities, &mod->identities);
        LY_CHECK_GOTO(rc, cleanup);
    }
    lysc_update_path(&ctx, NULL, "{submodule}");
    LY_ARRAY_FOR(mod->parsed->includes, u) {
        submod = mod->parsed->includes[u].submodule;
        if (submod->identities) {
            ctx.pmod = (struct lysp_module *)submod;
            lysc_update_path(&ctx, NULL, submod->name);
            rc = lys_compile_identities_derived(&ctx, submod->identities, &mod->identities);
            lysc_update_path(&ctx, NULL, NULL);
        }

        if (rc) {
            break;
        }
    }
    lysc_update_path(&ctx, NULL, NULL);

cleanup:
    /* always needed when using lysc_update_path() */
    ly_log_location_revert(0, 0, 1, 0);
    return rc;
}